

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mgga_x_msb.c
# Opt level: O1

void mgga_x_msb_init(xc_func_type *p)

{
  double dVar1;
  uint uVar2;
  double *pdVar3;
  long lVar4;
  undefined8 *puVar5;
  long lVar6;
  ulong uVar7;
  long lVar8;
  long extraout_RDX;
  long lVar9;
  long in_RSI;
  long *plVar10;
  long in_R9;
  ulong uVar11;
  undefined8 uVar12;
  double dVar13;
  double dVar14;
  double dVar15;
  double dVar16;
  undefined8 uVar17;
  undefined8 uVar18;
  double dVar19;
  double dVar20;
  double dVar21;
  double dVar22;
  double dVar23;
  double dVar24;
  double dVar25;
  long *unaff_retaddr;
  
  plVar10 = (long *)0x18;
  puVar5 = (undefined8 *)malloc(0x18);
  p->params = puVar5;
  uVar2 = p->info->number;
  uVar7 = (ulong)uVar2;
  if (uVar2 == 300) {
    uVar12 = 0x3fe020c49ba5e354;
    uVar17 = 0x3fc2b26bf8769ec3;
    uVar18 = 0x3ff8c00000000000;
  }
  else {
    if (uVar2 != 0x12d) {
      mgga_x_msb_init_cold_1();
      if (in_RSI != 0) {
        lVar4 = plVar10[1];
        dVar22 = 0.0;
        lVar9 = 0;
        do {
          if ((int)lVar4 == 2) {
            lVar6 = (int)plVar10[9] * lVar9;
            dVar19 = *(double *)(extraout_RDX + lVar6 * 8) +
                     *(double *)(extraout_RDX + 8 + lVar6 * 8);
          }
          else {
            dVar19 = *(double *)(extraout_RDX + (int)plVar10[9] * lVar9 * 8);
          }
          dVar1 = (double)plVar10[0x30];
          if (dVar1 <= dVar19) {
            dVar19 = *(double *)(extraout_RDX + (int)plVar10[9] * lVar9 * 8);
            if (dVar19 <= dVar1) {
              dVar19 = dVar1;
            }
            dVar20 = (double)plVar10[0x32] * (double)plVar10[0x32];
            dVar25 = *(double *)(uVar7 + *(int *)((long)plVar10 + 0x4c) * lVar9 * 8);
            if (dVar25 <= dVar20) {
              dVar25 = dVar20;
            }
            uVar2 = *(uint *)(*plVar10 + 0x40);
            if ((uVar2 >> 0x10 & 1) != 0) {
              dVar22 = *(double *)(in_R9 + *(int *)((long)plVar10 + 0x54) * lVar9 * 8);
              if (dVar22 <= (double)plVar10[0x33]) {
                dVar22 = (double)plVar10[0x33];
              }
              if (((uVar2 >> 0x11 & 1) != 0) && (dVar20 = dVar19 * 8.0 * dVar22, dVar20 <= dVar25))
              {
                dVar25 = dVar20;
              }
            }
            dVar20 = 0.0;
            if (dVar1 < dVar19 * 0.5) {
              dVar1 = (double)plVar10[0x31];
              dVar20 = (double)(-(ulong)(dVar1 < 1.0) & 0x3ff0000000000000 |
                               ~-(ulong)(dVar1 < 1.0) & (ulong)(dVar1 + -1.0 + 1.0));
              uVar11 = -(ulong)(dVar20 <= dVar1);
              dVar1 = (double)(uVar11 & (ulong)dVar1 | ~uVar11 & (ulong)dVar20);
              dVar20 = cbrt(dVar1);
              pdVar3 = (double *)plVar10[0x2f];
              dVar13 = cbrt(dVar19);
              dVar21 = 1.0 / (dVar13 * dVar13);
              dVar14 = (dVar21 / dVar19) * dVar22 * 1.5874010519681996;
              dVar15 = cbrt(9.869604401089358);
              dVar16 = dVar15 * dVar15 * 0.9905781746683879 + dVar14;
              dVar23 = dVar16 * dVar16;
              dVar25 = dVar25 * 1.5874010519681996 * (dVar21 / (dVar19 * dVar19));
              dVar14 = dVar25 * -0.125 + dVar14;
              dVar21 = dVar14 * dVar14;
              dVar24 = dVar21 * -4.0 * (1.0 / dVar23) + 1.0;
              dVar19 = *pdVar3;
              dVar25 = (1.0 / (dVar15 * dVar15)) * 1.8171205928321397 * 0.0051440329218107 * dVar25
                       + dVar19;
              dVar15 = (1.0 - dVar19 / dVar25) * dVar19;
              dVar20 = dVar20 * dVar1 * dVar13 * -0.36927938319101117 *
                       (((1.0 - dVar19 / (dVar25 + pdVar3[1])) * dVar19 - dVar15) *
                        (1.0 / (dVar21 * dVar21 * pdVar3[2] * dVar21 * 64.0 *
                                ((1.0 / (dVar23 * dVar23)) / dVar23) +
                                dVar14 * dVar21 * 8.0 * (1.0 / (dVar16 * dVar23)) + 1.0)) *
                        dVar24 * dVar24 * dVar24 + dVar15 + 1.0);
              dVar20 = dVar20 + dVar20;
            }
            lVar6 = *unaff_retaddr;
            if ((uVar2 & 1) != 0 && lVar6 != 0) {
              lVar8 = (int)plVar10[0xb] * lVar9;
              *(double *)(lVar6 + lVar8 * 8) = dVar20 + *(double *)(lVar6 + lVar8 * 8);
            }
          }
          lVar9 = lVar9 + 1;
        } while (in_RSI != lVar9);
      }
      return;
    }
    uVar12 = 0x3fe40aa64c2f837b;
    uVar17 = 0x3fbf67f4dbdf8f47;
    uVar18 = 0x401134538ef34d6a;
  }
  puVar5[2] = uVar18;
  *puVar5 = uVar12;
  puVar5[1] = uVar17;
  return;
}

Assistant:

static void
mgga_x_msb_init(xc_func_type *p)
{
  mgga_x_msb_params *params;

  assert(p!=NULL && p->params == NULL);
  p->params = libxc_malloc(sizeof(mgga_x_msb_params));
  params = (mgga_x_msb_params *)p->params;

  switch(p->info->number){
  case XC_MGGA_X_MS2B:
    params->kappa = 0.504;
    params->b     = (27.0*4.0 - 9.0)/64.0;
    params->c     = 0.14607;
    break;
  case XC_MGGA_X_MS2BS:
    params->kappa = 0.6263;
    params->b     = 4.3011;
    params->c     = 0.12268;
    break;
  default:
    fprintf(stderr, "Internal error in mgga_x_msb\n");
    exit(1);
  }
}